

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

void oonf_rfc5444_reconfigure_interface
               (oonf_rfc5444_interface *interf,oonf_packet_managed_config *config)

{
  oonf_log_source oVar1;
  int iVar2;
  oonf_rfc5444_target *poVar3;
  undefined8 uVar4;
  undefined1 local_f8 [8];
  netaddr_str buf;
  uint16_t port;
  oonf_rfc5444_target *old;
  oonf_rfc5444_target *target;
  oonf_packet_managed_config *config_local;
  oonf_rfc5444_interface *interf_local;
  
  if (config == (oonf_packet_managed_config *)0x0) {
    target = (oonf_rfc5444_target *)&interf->_socket_config;
  }
  else {
    oonf_packet_copy_managed_config(&interf->_socket_config,config);
    strscpy((interf->_socket_config).interface,interf,0x10);
    target = (oonf_rfc5444_target *)config;
  }
  (interf->_socket_config).mesh = true;
  buf.buf._54_2_ = interf->protocol->port;
  if (((interf->_socket_config).rawip & 1U) == 0) {
    if ((interf->_socket_config).multicast_port == 0) {
      (interf->_socket_config).multicast_port = (uint)(ushort)buf.buf._54_2_;
    }
    if (((interf->protocol->fixed_local_port & 1U) != 0) && ((interf->_socket_config).port == 0)) {
      (interf->_socket_config).port = (uint)(ushort)buf.buf._54_2_;
    }
  }
  else {
    (interf->_socket_config).port = 0;
    (interf->_socket_config).multicast_port = 0;
    (interf->_socket_config).protocol = interf->protocol->ip_proto;
  }
  if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    oonf_log(2,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x2d1,0,0,
             "Reconfigure RFC5444 interface %s to port %u/%u and protocol %d",interf,
             (interf->_socket_config).port,(interf->_socket_config).multicast_port,
             (interf->_socket_config).protocol);
  }
  iVar2 = strcmp(interf->name,"any");
  if (iVar2 == 0) {
    memset(&(interf->_socket_config).multicast_v4,0,0x12);
    memset(&(interf->_socket_config).multicast_v6,0,0x12);
    (interf->_socket_config).port = (uint)(ushort)buf.buf._54_2_;
    (interf->_socket_config).interface[0] = '\0';
    netaddr_acl_from_strarray(&(interf->_socket_config).bindto,&_unicast_bindto_acl_value);
  }
  if (buf.buf._54_2_ == 0) {
    if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
      oonf_log(2,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x2de,0,0,
               "    delay configuration, we still lack to protocol port");
    }
  }
  else {
    oonf_packet_apply_managed(&interf->_socket,&interf->_socket_config);
    if (interf->multicast4 == (oonf_rfc5444_target *)0x0) {
      stack0xffffffffffffff48 = (oonf_rfc5444_target *)0x0;
    }
    else {
      unique0x00012000 = interf->multicast4;
      interf->multicast4 = (oonf_rfc5444_target *)0x0;
    }
    if ((char)(target->rfc5444_target)._pkt.max != '\0') {
      poVar3 = _create_target(interf,(netaddr *)&(target->rfc5444_target)._pkt.allocated,false);
      oVar1 = _oonf_rfc5444_subsystem.logging;
      if (poVar3 == (oonf_rfc5444_target *)0x0) {
        if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 4) != 0) {
          uVar4 = netaddr_to_prefixstring(local_f8,&(target->rfc5444_target)._pkt.allocated,0);
          oonf_log(4,oVar1,"src/base/oonf_rfc5444.c",0x2f1,0,0,
                   "Could not create multicast target %s for interface %s",uVar4,interf);
        }
        interf->multicast4 = stack0xffffffffffffff48;
        stack0xffffffffffffff48 = (oonf_rfc5444_target *)0x0;
      }
      else {
        interf->multicast4 = poVar3;
      }
    }
    if (stack0xffffffffffffff48 != (oonf_rfc5444_target *)0x0) {
      _destroy_target(stack0xffffffffffffff48);
    }
    if (interf->multicast6 == (oonf_rfc5444_target *)0x0) {
      stack0xffffffffffffff48 = (oonf_rfc5444_target *)0x0;
    }
    else {
      unique0x00012000 = interf->multicast6;
      interf->multicast6 = (oonf_rfc5444_target *)0x0;
    }
    if ((target->dst)._addr[2] != '\0') {
      poVar3 = _create_target(interf,(netaddr *)((long)&(target->rfc5444_target)._pkt.max + 2),false
                             );
      oVar1 = _oonf_rfc5444_subsystem.logging;
      if (poVar3 == (oonf_rfc5444_target *)0x0) {
        if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 4) != 0) {
          uVar4 = netaddr_to_prefixstring
                            (local_f8,(undefined1 *)((long)&(target->rfc5444_target)._pkt.max + 2),0
                            );
          oonf_log(4,oVar1,"src/base/oonf_rfc5444.c",0x309,0,0,
                   "Could not create multicast socket %s for interface %s",uVar4,interf);
        }
        interf->multicast6 = stack0xffffffffffffff48;
        stack0xffffffffffffff48 = (oonf_rfc5444_target *)0x0;
      }
      else {
        interf->multicast6 = poVar3;
      }
    }
    if (stack0xffffffffffffff48 != (oonf_rfc5444_target *)0x0) {
      _destroy_target(stack0xffffffffffffff48);
    }
  }
  return;
}

Assistant:

void
oonf_rfc5444_reconfigure_interface(struct oonf_rfc5444_interface *interf, struct oonf_packet_managed_config *config) {
  struct oonf_rfc5444_target *target, *old;
  uint16_t port;
  struct netaddr_str buf;

  if (config != NULL) {
    /* copy socket configuration */
    oonf_packet_copy_managed_config(&interf->_socket_config, config);

    /* overwrite interface name */
    strscpy(interf->_socket_config.interface, interf->name, sizeof(interf->_socket_config.interface));
  }
  else {
    config = &interf->_socket_config;
  }

  /* always mesh socket */
  interf->_socket_config.mesh = true;

  /* get port */
  port = interf->protocol->port;

  /* set fixed configuration options */
  if (interf->_socket_config.rawip) {
    interf->_socket_config.port = 0;
    interf->_socket_config.multicast_port = 0;
    interf->_socket_config.protocol = interf->protocol->ip_proto;
  }
  else {
    if (interf->_socket_config.multicast_port == 0) {
      interf->_socket_config.multicast_port = port;
    }
    if (interf->protocol->fixed_local_port && interf->_socket_config.port == 0) {
      interf->_socket_config.port = port;
    }
  }

  OONF_INFO(LOG_RFC5444, "Reconfigure RFC5444 interface %s to port %u/%u and protocol %d", interf->name,
    interf->_socket_config.port, interf->_socket_config.multicast_port, interf->_socket_config.protocol);

  if (strcmp(interf->name, RFC5444_UNICAST_INTERFACE) == 0) {
    /* unicast interface */
    netaddr_invalidate(&interf->_socket_config.multicast_v4);
    netaddr_invalidate(&interf->_socket_config.multicast_v6);
    interf->_socket_config.port = port;
    interf->_socket_config.interface[0] = 0;
    netaddr_acl_from_strarray(&interf->_socket_config.bindto, &_unicast_bindto_acl_value);
  }

  if (port == 0) {
    /* delay configuration apply */
    OONF_INFO(LOG_RFC5444, "    delay configuration, we still lack to protocol port");
    return;
  }

  /* apply socket configuration */
  oonf_packet_apply_managed(&interf->_socket, &interf->_socket_config);

  /* handle IPv4 multicast target */
  if (interf->multicast4) {
    old = interf->multicast4;
    interf->multicast4 = NULL;
  }
  else {
    old = NULL;
  }
  if (netaddr_get_address_family(&config->multicast_v4) != AF_UNSPEC) {
    target = _create_target(interf, &config->multicast_v4, false);
    if (target == NULL) {
      OONF_WARN(LOG_RFC5444, "Could not create multicast target %s for interface %s",
        netaddr_to_string(&buf, &config->multicast_v4), interf->name);
      interf->multicast4 = old;
      old = NULL;
    }
    else {
      interf->multicast4 = target;
    }
  }
  if (old) {
    _destroy_target(old);
  }

  /* handle IPv6 multicast target */
  if (interf->multicast6) {
    old = interf->multicast6;
    interf->multicast6 = NULL;
  }
  else {
    old = NULL;
  }
  if (netaddr_get_address_family(&config->multicast_v6) != AF_UNSPEC) {
    target = _create_target(interf, &config->multicast_v6, false);
    if (target == NULL) {
      OONF_WARN(LOG_RFC5444, "Could not create multicast socket %s for interface %s",
        netaddr_to_string(&buf, &config->multicast_v6), interf->name);
      interf->multicast6 = old;
      old = NULL;
    }
    else {
      interf->multicast6 = target;
    }
  }
  if (old) {
    _destroy_target(old);
  }
}